

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::IndexOfHelper<true>(Arguments *args,ScriptContext *scriptContext)

{
  JavascriptLibrary *pJVar1;
  JavascriptBoolean *pJVar2;
  code *pcVar3;
  unsigned_long fromIndex_00;
  uint fromIndex_01;
  bool bVar4;
  uint32 uVar5;
  BOOL BVar6;
  int iVar7;
  Var pvVar8;
  uint64 uVar9;
  undefined4 *puVar10;
  TypedArrayBase *pArr_00;
  JavascriptBoolean *pJVar11;
  uint64 toIndex;
  JavascriptNativeIntArray *pArr_01;
  JavascriptNativeFloatArray *pArr_02;
  unsigned_long local_88;
  uint64 fromIndex64;
  RecyclableObject *obj;
  JsReentLock jsReentLock;
  JavascriptArray *pArr;
  Var search;
  BigIndex length;
  uint32 fromIndex;
  
  obj = (RecyclableObject *)scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)obj)->noJsReentrancy;
  ((ThreadContext *)obj)->noJsReentrancy = true;
  pvVar8 = Arguments::operator[](args,0);
  JsReentLock::setObjectForMutation((JsReentLock *)&obj,pvVar8);
  fromIndex64 = 0;
  jsReentLock.m_savedNoJsReentrancy = false;
  jsReentLock._25_7_ = 0;
  BigIndex::BigIndex((BigIndex *)&search,0);
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pJVar2 = (pJVar1->super_JavascriptLibraryBase).booleanTrue.ptr;
  pJVar11 = (pJVar1->super_JavascriptLibraryBase).booleanFalse.ptr;
  *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
  pvVar8 = Arguments::operator[](args,0);
  TryGetArrayAndLength<Js::JavascriptArray::BigIndex>
            (pvVar8,scriptContext,L"Array.prototype.indexOf",
             (JavascriptArray **)&jsReentLock.m_savedNoJsReentrancy,
             (RecyclableObject **)&fromIndex64,(BigIndex *)&search);
  JsReentLock::MutateArrayObject((JsReentLock *)&obj);
  *(undefined1 *)&obj[0x10].type.ptr = 1;
  length.bigIndex._4_4_ = 0;
  local_88 = 0;
  if (((jsReentLock._24_8_ == 0) &&
      (bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)fromIndex64),
      !bVar4)) || (((int)search == -1 && (length._0_8_ != 0xffffffff)))) {
    *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
    if ((int)search == -1) {
      uVar9 = BigIndex::GetBigIndex((BigIndex *)&search);
      BVar6 = GetParamForIndexOf<unsigned_long>(uVar9,args,&pArr,&local_88,scriptContext);
      JsReentLock::MutateArrayObject((JsReentLock *)&obj);
    }
    else {
      uVar5 = BigIndex::GetSmallIndex((BigIndex *)&search);
      BVar6 = GetParamForIndexOf<unsigned_int>
                        (uVar5,args,&pArr,(uint *)((long)&length.bigIndex + 4),scriptContext);
      JsReentLock::MutateArrayObject((JsReentLock *)&obj);
    }
  }
  else {
    if (((int)search != -1) || (uVar5 = 0xffffffff, length._0_8_ != 0xffffffff)) {
      uVar5 = BigIndex::GetSmallIndex((BigIndex *)&search);
    }
    *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
    BVar6 = GetParamForIndexOf<unsigned_int>
                      (uVar5,args,&pArr,(uint *)((long)&length.bigIndex + 4),scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)&obj);
  }
  *(undefined1 *)&obj[0x10].type.ptr = 1;
  if (BVar6 != 0) {
    if ((jsReentLock._24_8_ != 0) && (bVar4 = IsNonES5Array((Var)fromIndex64), !bVar4)) {
      bVar4 = VarIs<Js::ES5Array,Js::RecyclableObject>((RecyclableObject *)fromIndex64);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0xf86,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar4) goto LAB_00b99b80;
        *puVar10 = 0;
      }
      jsReentLock.m_savedNoJsReentrancy = false;
      jsReentLock._25_7_ = 0;
    }
    uVar9 = fromIndex64;
    if ((jsReentLock._24_8_ == 0) || (((int)search == -1 && (length._0_8_ != 0xffffffff)))) {
      bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)fromIndex64);
      if (bVar4) {
        pArr_00 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)uVar9);
      }
      else {
        pArr_00 = (TypedArrayBase *)0x0;
      }
      fromIndex_01 = length.bigIndex._4_4_;
      uVar9 = fromIndex64;
      fromIndex_00 = local_88;
      if ((pArr_00 == (TypedArrayBase *)0x0) ||
         (((int)search == -1 && (length._0_8_ != 0xffffffff)))) {
        *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
        if ((int)search == -1) {
          toIndex = BigIndex::GetBigIndex((BigIndex *)&search);
          pJVar11 = (JavascriptBoolean *)
                    TemplatedIndexOfHelper<true,Js::RecyclableObject,unsigned_long>
                              ((RecyclableObject *)uVar9,pArr,fromIndex_00,toIndex,scriptContext);
        }
        else {
          uVar5 = BigIndex::GetSmallIndex((BigIndex *)&search);
          pJVar11 = (JavascriptBoolean *)
                    TemplatedIndexOfHelper<true,Js::RecyclableObject,unsigned_int>
                              ((RecyclableObject *)uVar9,pArr,fromIndex_01,uVar5,scriptContext);
        }
      }
      else {
        *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
        uVar5 = BigIndex::GetSmallIndex((BigIndex *)&search);
        pJVar11 = (JavascriptBoolean *)
                  TemplatedIndexOfHelper<true,Js::TypedArrayBase,unsigned_int>
                            (pArr_00,pArr,fromIndex_01,uVar5,scriptContext);
      }
    }
    else {
      if (((int)search != -1) || (uVar5 = 0xffffffff, length._0_8_ != 0xffffffff)) {
        uVar5 = BigIndex::GetSmallIndex((BigIndex *)&search);
      }
      *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
      iVar7 = (**(code **)(*(long *)jsReentLock._24_8_ + 0x3c0))
                        (jsReentLock._24_8_,pArr,(undefined1 *)((long)&length.bigIndex + 4),uVar5,1,
                         scriptContext);
      JsReentLock::MutateArrayObject((JsReentLock *)&obj);
      *(undefined1 *)&obj[0x10].type.ptr = 1;
      if (length.bigIndex._4_4_ == 0xffffffff || iVar7 != -1) {
        if (iVar7 != -1) {
          pJVar11 = pJVar2;
        }
      }
      else {
        iVar7 = **(int **)(jsReentLock._24_8_ + 8);
        if (iVar7 == 0x20) {
          *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
          pArr_02 = UnsafeVarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>
                              ((JavascriptArray *)jsReentLock._24_8_);
          pJVar11 = (JavascriptBoolean *)
                    TemplatedIndexOfHelper<true,Js::JavascriptNativeFloatArray,unsigned_int>
                              (pArr_02,pArr,length.bigIndex._4_4_,uVar5,scriptContext);
        }
        else if (iVar7 == 0x1e) {
          *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
          pArr_01 = UnsafeVarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>
                              ((JavascriptArray *)jsReentLock._24_8_);
          pJVar11 = (JavascriptBoolean *)
                    TemplatedIndexOfHelper<true,Js::JavascriptNativeIntArray,unsigned_int>
                              (pArr_01,pArr,length.bigIndex._4_4_,uVar5,scriptContext);
        }
        else {
          if (iVar7 == 0x1d) {
            *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0xfab,"(0)","invalid array typeid");
            if (!bVar4) {
LAB_00b99b80:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar10 = 0;
            *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
          }
          pJVar11 = (JavascriptBoolean *)
                    TemplatedIndexOfHelper<true,Js::JavascriptArray,unsigned_int>
                              ((JavascriptArray *)jsReentLock._24_8_,pArr,length.bigIndex._4_4_,
                               uVar5,scriptContext);
        }
      }
    }
  }
  *(undefined1 *)&obj[0x10].type.ptr = jsReentLock.m_arrayObject2._0_1_;
  return pJVar11;
}

Assistant:

Var JavascriptArray::IndexOfHelper(Arguments const & args, ScriptContext *scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        RecyclableObject* obj = nullptr;
        JavascriptArray* pArr = nullptr;
        BigIndex length;
        Var trueValue = scriptContext->GetLibrary()->GetTrue();
        Var falseValue = scriptContext->GetLibrary()->GetFalse();

        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.indexOf"), &pArr, &obj, &length));
        Var search;
        uint32 fromIndex = 0;
        uint64 fromIndex64 = 0;

        // The evaluation of method arguments may change the type of the array. Hence, we do that prior to the actual helper method calls.
        // The if clause of the conditional statement below applies to an JavascriptArray or TypedArray instances. The rest of the conditional
        // clauses apply to an ES5Array or other valid Javascript objects.
        if ((pArr || VarIs<TypedArrayBase>(obj)) && (length.IsSmallIndex() || length.IsUint32Max()))
        {
            uint32 len = length.IsUint32Max() ? MaxArrayLength : length.GetSmallIndex();
            JS_REENTRANT(jsReentLock, BOOL gotParam = GetParamForIndexOf(len, args, search, fromIndex, scriptContext));
            if (!gotParam)
            {
                return includesAlgorithm ? falseValue : TaggedInt::ToVarUnchecked(-1);
            }
        }
        else if (length.IsSmallIndex())
        {
            JS_REENTRANT(jsReentLock, BOOL gotParam = GetParamForIndexOf(length.GetSmallIndex(), args, search, fromIndex, scriptContext));
            if (!gotParam)
            {
                return includesAlgorithm ? falseValue : TaggedInt::ToVarUnchecked(-1);
            }
        }
        else
        {
            JS_REENTRANT(jsReentLock, BOOL gotParam = GetParamForIndexOf(length.GetBigIndex(), args, search, fromIndex64, scriptContext));
            if (!gotParam)
            {
                return includesAlgorithm ? falseValue : TaggedInt::ToVarUnchecked(-1);
            }
        }

        // Side effects (such as defining a property in a ToPrimitive call) during evaluation of fromIndex argument may convert the array to an ES5 array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr)
        {
            if (length.IsSmallIndex() || length.IsUint32Max())
            {
                uint32 len = length.IsUint32Max() ? MaxArrayLength : length.GetSmallIndex();
                JS_REENTRANT(jsReentLock, int32 index = pArr->HeadSegmentIndexOfHelper(search, fromIndex, len, includesAlgorithm, scriptContext));

                // If we found the search value in the head segment, or if we determined there is no need to search other segments,
                // we stop right here.
                if (index != -1 || fromIndex == -1)
                {
                    if (includesAlgorithm)
                    {
                        //Array.prototype.includes
                        return (index == -1) ? falseValue : trueValue;
                    }
                    else
                    {
                        //Array.prototype.indexOf
                        return JavascriptNumber::ToVar(index, scriptContext);
                    }
                }

                //  If we really must search other segments, let's do it now. We'll have to search the slow way (dealing with holes, etc.).
                switch (pArr->GetTypeId())
                {
                case Js::TypeIds_Array:
                    JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(pArr, search, fromIndex, len, scriptContext));
                case Js::TypeIds_NativeIntArray:
                    JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(UnsafeVarTo<JavascriptNativeIntArray>(pArr), search, fromIndex, len, scriptContext));
                case Js::TypeIds_NativeFloatArray:
                    JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(UnsafeVarTo<JavascriptNativeFloatArray>(pArr), search, fromIndex, len, scriptContext));
                default:
                    AssertMsg(FALSE, "invalid array typeid");
                    JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(pArr, search, fromIndex, len, scriptContext));
                }
            }
        }

        // source object is not a JavascriptArray but source could be a TypedArray
        TypedArrayBase * typedArrayObj = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(obj);
        if (typedArrayObj)
        {
            if (length.IsSmallIndex() || length.IsUint32Max())
            {
                JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(typedArrayObj, search, fromIndex, length.GetSmallIndex(), scriptContext));
            }
        }
        if (length.IsSmallIndex())
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(obj, search, fromIndex, length.GetSmallIndex(), scriptContext));
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return TemplatedIndexOfHelper<includesAlgorithm>(obj, search, fromIndex64, length.GetBigIndex(), scriptContext));
        }
    }